

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

bool __thiscall pbrt::Transform::HasScale(Transform *this,Float tolerance)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 auVar6 [16];
  undefined8 uVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  Vector3<float> VVar10;
  Vector3<float> VVar11;
  Vector3<float> VVar12;
  Tuple3<pbrt::Vector3,_float> local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  uVar8 = 0;
  local_38._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  local_38.z = 0.0;
  VVar10 = operator()(this,(Vector3<float> *)&local_38);
  auVar6._0_4_ = VVar10.super_Tuple3<pbrt::Vector3,_float>.x *
                 VVar10.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar6._4_4_ = VVar10.super_Tuple3<pbrt::Vector3,_float>.y *
                 VVar10.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar6._8_4_ = (float)uVar8 * (float)uVar8;
  fVar1 = (float)((ulong)uVar8 >> 0x20);
  auVar6._12_4_ = fVar1 * fVar1;
  auVar6 = vhaddps_avx(auVar6,auVar6);
  uVar8 = 0;
  local_38.x = 0.0;
  local_38.y = 1.0;
  local_38.z = 0.0;
  VVar11 = operator()(this,(Vector3<float> *)&local_38);
  local_28 = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.z = 1.0;
  uStack_20 = uVar8;
  VVar12 = operator()(this,(Vector3<float> *)&local_38);
  bVar5 = true;
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar6 = vandps_avx512vl(ZEXT416((uint)(VVar10.super_Tuple3<pbrt::Vector3,_float>.z *
                                          VVar10.super_Tuple3<pbrt::Vector3,_float>.z + auVar6._0_4_
                                         + -1.0)),auVar2);
  if (auVar6._0_4_ <= tolerance) {
    auVar9._0_4_ = (float)local_28 * (float)local_28;
    auVar9._4_4_ = local_28._4_4_ * local_28._4_4_;
    auVar9._8_4_ = (float)uStack_20 * (float)uStack_20;
    auVar9._12_4_ = uStack_20._4_4_ * uStack_20._4_4_;
    auVar6 = vhaddps_avx(auVar9,auVar9);
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar6 = vandps_avx512vl(ZEXT416((uint)(VVar11.super_Tuple3<pbrt::Vector3,_float>.z *
                                            VVar11.super_Tuple3<pbrt::Vector3,_float>.z +
                                            auVar6._0_4_ + -1.0)),auVar3);
    if (auVar6._0_4_ <= tolerance) {
      auVar7._0_4_ = VVar12.super_Tuple3<pbrt::Vector3,_float>.x *
                     VVar12.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar7._4_4_ = VVar12.super_Tuple3<pbrt::Vector3,_float>.y *
                     VVar12.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar7._8_4_ = (float)uVar8 * (float)uVar8;
      fVar1 = (float)((ulong)uVar8 >> 0x20);
      auVar7._12_4_ = fVar1 * fVar1;
      auVar6 = vhaddps_avx(auVar7,auVar7);
      auVar4._8_4_ = 0x7fffffff;
      auVar4._0_8_ = 0x7fffffff7fffffff;
      auVar4._12_4_ = 0x7fffffff;
      auVar6 = vandps_avx512vl(ZEXT416((uint)(VVar12.super_Tuple3<pbrt::Vector3,_float>.z *
                                              VVar12.super_Tuple3<pbrt::Vector3,_float>.z +
                                              auVar6._0_4_ + -1.0)),auVar4);
      bVar5 = tolerance < auVar6._0_4_;
    }
  }
  return bVar5;
}

Assistant:

PBRT_CPU_GPU
    bool HasScale(Float tolerance = 1e-3f) const {
        Float la2 = LengthSquared((*this)(Vector3f(1, 0, 0)));
        Float lb2 = LengthSquared((*this)(Vector3f(0, 1, 0)));
        Float lc2 = LengthSquared((*this)(Vector3f(0, 0, 1)));
        return (std::abs(la2 - 1) > tolerance || std::abs(lb2 - 1) > tolerance ||
                std::abs(lc2 - 1) > tolerance);
    }